

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflateCopy(zng_stream *dest,zng_stream *source)

{
  internal_state *__src;
  deflate_state *__dest;
  int iVar1;
  deflate_allocs *pdVar2;
  zng_stream *in_RSI;
  zng_stream *in_RDI;
  deflate_allocs *alloc_bufs;
  deflate_state *ss;
  deflate_state *ds;
  zng_stream *in_stack_ffffffffffffffc8;
  int32_t local_4;
  
  iVar1 = deflateStateCheck(in_RSI);
  if ((iVar1 == 0) && (in_RDI != (zng_stream *)0x0)) {
    __src = in_RSI->state;
    memcpy(in_RDI,in_RSI,0x68);
    pdVar2 = alloc_deflate((zng_stream *)ds,ss._4_4_,(int)ss);
    if (pdVar2 == (deflate_allocs *)0x0) {
      local_4 = -4;
    }
    else {
      __dest = pdVar2->state;
      in_RDI->state = __dest;
      memcpy(__dest,__src,0x1800);
      __dest->strm = in_RDI;
      __dest->alloc_bufs = pdVar2;
      __dest->window = pdVar2->window;
      __dest->prev = pdVar2->prev;
      __dest->head = pdVar2->head;
      __dest->pending_buf = pdVar2->pending_buf;
      if ((((__dest->window == (uchar *)0x0) || (__dest->prev == (Pos *)0x0)) ||
          (__dest->head == (Pos *)0x0)) || (__dest->pending_buf == (uchar *)0x0)) {
        zng_deflateEnd(in_stack_ffffffffffffffc8);
        local_4 = -4;
      }
      else {
        memcpy(__dest->window,__src->window,(ulong)(__dest->w_size << 1));
        memcpy(__dest->prev,__src->prev,(ulong)__dest->w_size << 1);
        memcpy(__dest->head,__src->head,0x20000);
        memcpy(__dest->pending_buf,__src->pending_buf,(ulong)(__dest->lit_bufsize * 5));
        __dest->pending_out =
             __dest->pending_buf + ((long)__src->pending_out - (long)__src->pending_buf);
        __dest->d_buf = (uint16_t *)(__dest->pending_buf + (__dest->lit_bufsize << 1));
        __dest->l_buf = __dest->pending_buf + (__dest->lit_bufsize << 2);
        (__dest->l_desc).dyn_tree = __dest->dyn_ltree;
        (__dest->d_desc).dyn_tree = __dest->dyn_dtree;
        (__dest->bl_desc).dyn_tree = __dest->bl_tree;
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateCopy)(PREFIX3(stream) *dest, PREFIX3(stream) *source) {
    deflate_state *ds;
    deflate_state *ss;

    if (deflateStateCheck(source) || dest == NULL)
        return Z_STREAM_ERROR;

    ss = source->state;

    memcpy((void *)dest, (void *)source, sizeof(PREFIX3(stream)));

    deflate_allocs *alloc_bufs = alloc_deflate(dest, ss->w_bits, ss->lit_bufsize);
    if (alloc_bufs == NULL)
        return Z_MEM_ERROR;

    ds = alloc_bufs->state;

    dest->state = (struct internal_state *) ds;
    memcpy(ds, ss, sizeof(deflate_state));
    ds->strm = dest;

    ds->alloc_bufs = alloc_bufs;
    ds->window = alloc_bufs->window;
    ds->prev = alloc_bufs->prev;
    ds->head = alloc_bufs->head;
    ds->pending_buf = alloc_bufs->pending_buf;

    if (ds->window == NULL || ds->prev == NULL || ds->head == NULL || ds->pending_buf == NULL) {
        PREFIX(deflateEnd)(dest);
        return Z_MEM_ERROR;
    }

    memcpy(ds->window, ss->window, DEFLATE_ADJUST_WINDOW_SIZE(ds->w_size * 2 * sizeof(unsigned char)));
    memcpy((void *)ds->prev, (void *)ss->prev, ds->w_size * sizeof(Pos));
    memcpy((void *)ds->head, (void *)ss->head, HASH_SIZE * sizeof(Pos));
    memcpy(ds->pending_buf, ss->pending_buf, ds->lit_bufsize * LIT_BUFS);

    ds->pending_out = ds->pending_buf + (ss->pending_out - ss->pending_buf);
#ifdef LIT_MEM
    ds->d_buf = (uint16_t *)(ds->pending_buf + (ds->lit_bufsize << 1));
    ds->l_buf = ds->pending_buf + (ds->lit_bufsize << 2);
#else
    ds->sym_buf = ds->pending_buf + ds->lit_bufsize;
#endif

    ds->l_desc.dyn_tree = ds->dyn_ltree;
    ds->d_desc.dyn_tree = ds->dyn_dtree;
    ds->bl_desc.dyn_tree = ds->bl_tree;

    return Z_OK;
}